

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.h
# Opt level: O2

void __thiscall google::protobuf::MapValueRef::SetFloatValue(MapValueRef *this,float value)

{
  CppType CVar1;
  LogMessage *pLVar2;
  LogMessageFatal local_38 [16];
  char *local_28;
  char *local_20;
  
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  if (CVar1 == CPPTYPE_FLOAT) {
    *(float *)(this->super_MapValueConstRef).data_ = value;
    return;
  }
  absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
            (local_38,
             "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/map_field.h"
             ,0x35f);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     ((LogMessage *)local_38,(char (*) [34])"Protocol Buffer map usage error:\n");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [27])"MapValueRef::SetFloatValue");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [22])" type does not match\n");
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Expected : ");
  local_20 = (char *)0x2ff087;
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>
                     (pLVar2,&local_20);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar2,(char (*) [2])0x30a47e);
  pLVar2 = absl::lts_20240722::log_internal::LogMessage::operator<<
                     (pLVar2,(char (*) [14])"  Actual   : ");
  CVar1 = MapValueConstRef::type(&this->super_MapValueConstRef);
  local_28 = *(char **)(FieldDescriptor::kCppTypeToName + (ulong)CVar1 * 8);
  absl::lts_20240722::log_internal::LogMessage::operator<<<const_char_*,_0>(pLVar2,&local_28);
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_38);
}

Assistant:

void SetFloatValue(float value) {
    TYPE_CHECK(FieldDescriptor::CPPTYPE_FLOAT, "MapValueRef::SetFloatValue");
    *reinterpret_cast<float*>(data_) = value;
  }